

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O2

void __thiscall
slang::ast::PatternCaseStatement::visitExprs<no_legacy_generate::MainVisitor&>
          (PatternCaseStatement *this,AlwaysFFVisitor *visitor)

{
  long lVar1;
  ItemGroup *item;
  pointer pIVar2;
  
  Expression::visit<no_legacy_generate::MainVisitor&>(this->expr,visitor);
  pIVar2 = (this->items)._M_ptr;
  for (lVar1 = (this->items)._M_extent._M_extent_value * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    Pattern::visit<no_legacy_generate::MainVisitor>((pIVar2->pattern).ptr,visitor);
    if (pIVar2->filter != (Expression *)0x0) {
      Expression::visit<no_legacy_generate::MainVisitor&>(pIVar2->filter,visitor);
    }
    pIVar2 = pIVar2 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            item.pattern->visit(visitor);
            if (item.filter)
                item.filter->visit(visitor);
        }
    }